

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanSpace(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  lVar6 = 0;
  do {
    lVar4 = (this->putStack).tos;
    if (lVar4 == -1) {
      lVar4 = this->readBufferPos;
      if (lVar4 < (this->readBuffer).d.size) {
        this->readBufferPos = lVar4 + 1;
        uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar4];
      }
      else {
        uVar7 = getChar_helper(this);
      }
    }
    else {
      uVar7 = 0xffffffff;
      if (this->atEnd == false) {
        uVar7 = (this->putStack).data[lVar4];
        (this->putStack).tos = lVar4 + -1;
      }
    }
    if ((int)uVar7 < 0xd) {
      if (uVar7 != 9) {
        if (uVar7 != 10) {
          if (uVar7 != 0xffffffff) {
LAB_003a6d2f:
            lVar4 = (this->putStack).tos;
            lVar1 = (this->putStack).cap;
            if (lVar1 <= lVar4 + 1) {
              lVar4 = lVar4 + 2;
              lVar8 = lVar1 * 2;
              if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == lVar4 + lVar1 * -2 < 0) {
                lVar8 = lVar4;
              }
              (this->putStack).cap = lVar8;
              puVar5 = (uint *)realloc((this->putStack).data,lVar8 << 2);
              (this->putStack).data = puVar5;
              if (puVar5 == (uint *)0x0) {
LAB_003a6da2:
                qBadAlloc();
              }
            }
            lVar4 = (this->putStack).tos;
            (this->putStack).tos = lVar4 + 1;
            (this->putStack).data[lVar4 + 1] = uVar7;
          }
          return lVar6;
        }
LAB_003a6cfc:
        this->lineNumber = this->lineNumber + 1;
        this->lastLineStart = this->readBufferPos + this->characterOffset;
      }
    }
    else if (uVar7 != 0x20) {
      if (uVar7 == 0xd) {
        lVar4 = (this->putStack).tos;
        if (lVar4 == -1) {
          if (this->readBufferPos < (this->readBuffer).d.size) {
            uVar3 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
          }
          else {
            uVar3 = getChar_helper(this);
            if (uVar3 == 0xffffffff) {
              uVar3 = 0xffffffff;
            }
            else {
              this->readBufferPos = this->readBufferPos + -1;
            }
          }
        }
        else {
          uVar3 = (this->putStack).data[lVar4];
        }
        if (uVar3 == 0xffffffff) {
          lVar4 = (this->putStack).tos;
          lVar1 = (this->putStack).cap;
          if (lVar1 <= lVar4 + 1) {
            lVar4 = lVar4 + 2;
            lVar8 = lVar1 * 2;
            if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == lVar4 + lVar1 * -2 < 0) {
              lVar8 = lVar4;
            }
            (this->putStack).cap = lVar8;
            puVar5 = (uint *)realloc((this->putStack).data,lVar8 << 2);
            (this->putStack).data = puVar5;
            if (puVar5 == (uint *)0x0) goto LAB_003a6da2;
          }
          lVar4 = (this->putStack).tos;
          (this->putStack).tos = lVar4 + 1;
          (this->putStack).data[lVar4 + 1] = 0xd;
          uVar7 = 0;
          bVar2 = true;
        }
        else {
          uVar7 = 10;
          if (uVar3 == 10) {
            lVar4 = (this->putStack).tos;
            if (lVar4 == -1) {
              this->readBufferPos = this->readBufferPos + 1;
            }
            else {
              (this->putStack).tos = lVar4 + -1;
            }
          }
          bVar2 = false;
        }
        if (bVar2) {
          return lVar6;
        }
        goto LAB_003a6cfc;
      }
      goto LAB_003a6d2f;
    }
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar7);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanSpace()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(c);
            ++n;
            break;
        default:
            putChar(c);
            return n;
        }
    }
    return n;
}